

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O1

int __thiscall Fl_Preferences::Node::nChildren(Node *this)

{
  int iVar1;
  Node *pNVar2;
  
  if ((this->field_0x30 & 4) == 0) {
    iVar1 = 0;
    for (pNVar2 = this->child_; pNVar2 != (Node *)0x0; pNVar2 = pNVar2->next_) {
      iVar1 = iVar1 + 1;
    }
  }
  else {
    iVar1 = this->nIndex_;
  }
  return iVar1;
}

Assistant:

int Fl_Preferences::Node::nChildren() {
  if (indexed_) {
    return nIndex_;
  } else {
    int cnt = 0;
    for ( Node *nd = child_; nd; nd = nd->next_ )
      cnt++;
    return cnt;
  }
}